

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O0

SurfaceBackendImpl * __thiscall
rengine::SDLBackend::createSurface(SDLBackend *this,Surface *surface)

{
  SDL_Window *pSVar1;
  SDL_GLContext pvVar2;
  Surface *surface_local;
  SDLBackend *this_local;
  
  if (surface == (Surface *)0x0) {
    __assert_fail("surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xa3,"virtual SurfaceBackendImpl *rengine::SDLBackend::createSurface(Surface *)")
    ;
  }
  if (this->m_surface != (Surface *)0x0) {
    __assert_fail("!m_surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xa5,"virtual SurfaceBackendImpl *rengine::SDLBackend::createSurface(Surface *)")
    ;
  }
  if (this->m_window != (SDL_Window *)0x0) {
    __assert_fail("!m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xa6,"virtual SurfaceBackendImpl *rengine::SDLBackend::createSurface(Surface *)")
    ;
  }
  if (this->m_gl != (SDL_GLContext)0x0) {
    __assert_fail("!m_gl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0xa7,"virtual SurfaceBackendImpl *rengine::SDLBackend::createSurface(Surface *)")
    ;
  }
  this->m_surface = surface;
  SDL_GL_SetAttribute(5,1);
  SDL_GL_SetAttribute(6,0);
  SDL_GL_SetAttribute(7,0);
  SDL_GL_SetAttribute(3,0);
  SDL_GL_SetAttribute(0xd,1);
  SDL_GL_SetAttribute(0xe,4);
  pSVar1 = (SDL_Window *)SDL_CreateWindow("rengine",0x2fff0000,0x2fff0000,800,0x1e0,0x200a);
  this->m_window = pSVar1;
  pvVar2 = (SDL_GLContext)SDL_GL_CreateContext(this->m_window);
  this->m_gl = pvVar2;
  SDL_GL_SetSwapInterval(1);
  (**(code **)(*(long *)this + 0x60))();
  return &this->super_SurfaceBackendImpl;
}

Assistant:

inline SurfaceBackendImpl *SDLBackend::createSurface(Surface *surface)
{
    assert(surface); // Called with valid input

    assert(!m_surface); // there can be only one!
    assert(!m_window);
    assert(!m_gl);

    m_surface = surface;

    SDL_GL_SetAttribute(SDL_GL_DOUBLEBUFFER, 1);
    SDL_GL_SetAttribute(SDL_GL_DEPTH_SIZE, 0);
    SDL_GL_SetAttribute(SDL_GL_STENCIL_SIZE, 0);
    SDL_GL_SetAttribute(SDL_GL_ALPHA_SIZE, 0);
    SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 1);
    SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, 4);

    m_window = SDL_CreateWindow("rengine", SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED,
                                800, 480, SDL_WINDOW_OPENGL | SDL_WINDOW_HIDDEN | SDL_WINDOW_ALLOW_HIGHDPI );

    m_gl = SDL_GL_CreateContext(m_window);
    SDL_GL_SetSwapInterval(1);

    requestRender();

    return this;
}